

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O0

bool __thiscall
r_exec::CTPX::build_mdl
          (CTPX *this,_Fact *cause,_Fact *consequent,GuardBuilder *guard_builder,uint64_t period)

{
  bool bVar1;
  int iVar2;
  HLPBindingMap *pHVar3;
  _Fact *p_Var4;
  undefined4 extraout_var;
  Code *pCVar5;
  P<r_code::Code> local_50;
  P<r_code::Code> m0;
  uint16_t write_index;
  P<r_exec::HLPBindingMap> local_38;
  P<r_exec::HLPBindingMap> bm;
  uint64_t period_local;
  GuardBuilder *guard_builder_local;
  _Fact *consequent_local;
  _Fact *cause_local;
  CTPX *this_local;
  
  bm.object = (_Object *)period;
  pHVar3 = (HLPBindingMap *)operator_new(0x40);
  HLPBindingMap::HLPBindingMap(pHVar3);
  core::P<r_exec::HLPBindingMap>::P(&local_38,pHVar3);
  pHVar3 = core::P<r_exec::HLPBindingMap>::operator->(&local_38);
  p_Var4 = core::P<r_exec::_Fact>::operator->(&(this->super__TPX).super_TPX.target);
  iVar2 = (*(p_Var4->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(p_Var4,0);
  BindingMap::init(&pHVar3->super_BindingMap,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar2));
  pHVar3 = core::P<r_exec::HLPBindingMap>::operator->(&local_38);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
  BindingMap::init(&pHVar3->super_BindingMap,(EVP_PKEY_CTX *)pCVar5);
  pHVar3 = core::P<r_exec::HLPBindingMap>::operator->(&local_38);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&(this->super__TPX).super_TPX.target);
  BindingMap::init(&pHVar3->super_BindingMap,(EVP_PKEY_CTX *)pCVar5);
  pHVar3 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_38);
  pCVar5 = _TPX::build_mdl_head
                     (&this->super__TPX,pHVar3,3,cause,consequent,(uint16_t *)((long)&m0.object + 2)
                     );
  core::P<r_code::Code>::P(&local_50,pCVar5);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&local_50);
  (*(guard_builder->super__Object)._vptr__Object[2])
            (guard_builder,pCVar5,0,cause,(undefined1 *)((long)&m0.object + 2));
  pCVar5 = core::P::operator_cast_to_Code_((P *)&local_50);
  _TPX::build_mdl_tail(&this->super__TPX,pCVar5,m0.object._2_2_);
  pHVar3 = core::P::operator_cast_to_HLPBindingMap_((P *)&local_38);
  pCVar5 = core::P::operator_cast_to_Code_((P *)&local_50);
  bVar1 = build_requirement(this,pHVar3,pCVar5,(uint64_t)bm.object);
  core::P<r_code::Code>::~P(&local_50);
  core::P<r_exec::HLPBindingMap>::~P(&local_38);
  return bVar1;
}

Assistant:

bool CTPX::build_mdl(_Fact *cause, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<HLPBindingMap> bm = new HLPBindingMap();
    bm->init(target->get_reference(0), MK_VAL_VALUE);
    bm->init(target, FACT_AFTER);
    bm->init(target, FACT_BEFORE);
    uint16_t write_index;
    P<Code> m0 = build_mdl_head(bm, 3, cause, consequent, write_index);
    guard_builder->build(m0, nullptr, cause, write_index);
    build_mdl_tail(m0, write_index);
    //std::cout<<Utils::RelativeTime(Now())<<" found --------------------- M0\n";
    return build_requirement(bm, m0, period); // existence checks performed there.
}